

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackExternalGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackExternalGenerator::cmCPackExternalVersionGenerator::WriteToJSON
          (cmCPackExternalVersionGenerator *this,Value *root)

{
  cmCPackExternalGenerator *pcVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  Value *pVVar5;
  vector<cmCPackInstallCMakeProject,_std::allocator<cmCPackInstallCMakeProject>_> *this_00;
  vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> *this_01;
  vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *this_02;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
  *this_03;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
  *this_04;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
  *this_05;
  Value *pVVar6;
  Value local_c50;
  reference local_c28;
  cmCPackComponent **component_2;
  iterator __end2_5;
  iterator __begin2_5;
  vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *__range2_5;
  Value *local_be0;
  Value *groupComponents;
  reference local_bb0;
  cmCPackComponentGroup **subgroup;
  iterator __end2_4;
  iterator __begin2_4;
  vector<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_> *__range2_4;
  Value *local_b68;
  Value *subgroups;
  Value local_b38;
  Value local_b10;
  Value local_ae8;
  Value local_ac0;
  Value local_a98;
  Value local_a70;
  Value *local_a48;
  Value *jsonGroup;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>
  *group;
  iterator __end1_3;
  iterator __begin1_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
  *__range1_3;
  Value *local_9f8;
  Value *groups;
  reference local_9c8;
  cmCPackComponent **dep;
  iterator __end2_3;
  iterator __begin2_3;
  vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *__range2_3;
  Value *local_980;
  Value *dependencies;
  reference local_950;
  cmCPackInstallationType **installationType_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> *__range2_2;
  Value *local_908;
  Value *cmpInstallationTypes;
  Value local_8d8;
  Value local_8b0;
  Value local_888;
  Value local_860;
  Value local_838;
  Value local_810;
  Value local_7e8;
  Value local_7c0;
  Value local_798;
  Value *local_770;
  Value *jsonComponent;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
  *component_1;
  iterator __end1_2;
  iterator __begin1_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
  *__range1_2;
  Value *local_720;
  Value *components;
  Value local_6f0;
  Value local_6c8;
  Value local_6a0;
  Value *local_678;
  Value *jsonInstallationType;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>
  *installationType_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
  *__range1_1;
  Value *local_628;
  Value *installationTypes;
  reference local_5f8;
  cmCPackComponent **component;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *__range2_1;
  Value *local_5b0;
  Value *components_1;
  reference local_580;
  cmCPackInstallationType **installationType;
  iterator __end2;
  iterator __begin2;
  vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> *__range2;
  Value *local_538;
  Value *installationTypes_1;
  Value local_508;
  Value local_4e0;
  Value local_4b8;
  undefined1 local_490 [8];
  Value jsonProject;
  cmCPackInstallCMakeProject *project;
  iterator __end1;
  iterator __begin1;
  vector<cmCPackInstallCMakeProject,_std::allocator<cmCPackInstallCMakeProject>_> *__range1;
  Value *local_420;
  Value *projects;
  string local_410;
  Value local_3f0;
  allocator<char> local_3c1;
  string local_3c0;
  Value local_3a0;
  allocator<char> local_371;
  string local_370;
  cmValue local_350;
  Value local_348;
  Value local_320;
  allocator<char> local_2f1;
  string local_2f0;
  cmValue local_2d0;
  Value local_2c8;
  Value local_2a0;
  allocator<char> local_271;
  string local_270;
  string *local_250;
  Value local_248;
  string *local_220;
  allocator<char> local_211;
  string local_210;
  cmValue local_1f0;
  cmValue defaultDirectoryPermissions;
  allocator<char> local_1b9;
  string local_1b8;
  cmValue local_198;
  cmValue buildConfigCstr;
  allocator<char> local_161;
  string local_160;
  cmValue local_140;
  cmValue packageDescriptionSummary;
  allocator<char> local_109;
  string local_108;
  cmValue local_e8;
  cmValue packageDescriptionFile;
  allocator<char> local_b1;
  string local_b0;
  cmValue local_90;
  cmValue packageVersion;
  allocator<char> local_49;
  string local_48;
  cmValue local_28;
  cmValue packageName;
  Value *root_local;
  cmCPackExternalVersionGenerator *this_local;
  
  packageName.Value = (string *)root;
  iVar3 = WriteVersion(this,root);
  if (iVar3 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    pcVar1 = this->Parent;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"CPACK_PACKAGE_NAME",&local_49);
    local_28 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    bVar2 = cmValue::operator_cast_to_bool(&local_28);
    if (bVar2) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_28);
      Json::Value::Value((Value *)&packageVersion,psVar4);
      pVVar5 = Json::Value::operator[]((Value *)packageName.Value,"packageName");
      Json::Value::operator=(pVVar5,(Value *)&packageVersion);
      Json::Value::~Value((Value *)&packageVersion);
    }
    pcVar1 = this->Parent;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"CPACK_PACKAGE_VERSION",&local_b1);
    local_90 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    bVar2 = cmValue::operator_cast_to_bool(&local_90);
    if (bVar2) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_90);
      Json::Value::Value((Value *)&packageDescriptionFile,psVar4);
      pVVar5 = Json::Value::operator[]((Value *)packageName.Value,"packageVersion");
      Json::Value::operator=(pVVar5,(Value *)&packageDescriptionFile);
      Json::Value::~Value((Value *)&packageDescriptionFile);
    }
    pcVar1 = this->Parent;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"CPACK_PACKAGE_DESCRIPTION_FILE",&local_109);
    local_e8 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    bVar2 = cmValue::operator_cast_to_bool(&local_e8);
    if (bVar2) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_e8);
      Json::Value::Value((Value *)&packageDescriptionSummary,psVar4);
      pVVar5 = Json::Value::operator[]((Value *)packageName.Value,"packageDescriptionFile");
      Json::Value::operator=(pVVar5,(Value *)&packageDescriptionSummary);
      Json::Value::~Value((Value *)&packageDescriptionSummary);
    }
    pcVar1 = this->Parent;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"CPACK_PACKAGE_DESCRIPTION_SUMMARY",&local_161);
    local_140 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    bVar2 = cmValue::operator_cast_to_bool(&local_140);
    if (bVar2) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_140);
      Json::Value::Value((Value *)&buildConfigCstr,psVar4);
      pVVar5 = Json::Value::operator[]((Value *)packageName.Value,"packageDescriptionSummary");
      Json::Value::operator=(pVVar5,(Value *)&buildConfigCstr);
      Json::Value::~Value((Value *)&buildConfigCstr);
    }
    pcVar1 = this->Parent;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,"CPACK_BUILD_CONFIG",&local_1b9);
    local_198 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator(&local_1b9);
    bVar2 = cmValue::operator_cast_to_bool(&local_198);
    if (bVar2) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_198);
      Json::Value::Value((Value *)&defaultDirectoryPermissions,psVar4);
      pVVar5 = Json::Value::operator[]((Value *)packageName.Value,"buildConfig");
      Json::Value::operator=(pVVar5,(Value *)&defaultDirectoryPermissions);
      Json::Value::~Value((Value *)&defaultDirectoryPermissions);
    }
    pcVar1 = this->Parent;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS",&local_211);
    local_1f0 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
    local_220 = local_1f0.Value;
    bVar2 = cmNonempty(local_1f0);
    if (bVar2) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_1f0);
      Json::Value::Value(&local_248,psVar4);
      pVVar5 = Json::Value::operator[]((Value *)packageName.Value,"defaultDirectoryPermissions");
      Json::Value::operator=(pVVar5,&local_248);
      Json::Value::~Value(&local_248);
    }
    pcVar1 = this->Parent;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"CPACK_SET_DESTDIR",&local_271);
    local_250 = (string *)cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,&local_270);
    bVar2 = cmIsInternallyOn((cmValue)local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    if (bVar2) {
      Json::Value::Value(&local_2a0,true);
      pVVar5 = Json::Value::operator[]((Value *)packageName.Value,"setDestdir");
      Json::Value::operator=(pVVar5,&local_2a0);
      Json::Value::~Value(&local_2a0);
      pcVar1 = this->Parent;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,"CPACK_PACKAGING_INSTALL_PREFIX",&local_2f1);
      local_2d0 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,&local_2f0);
      psVar4 = cmValue::operator*[abi_cxx11_(&local_2d0);
      Json::Value::Value(&local_2c8,psVar4);
      pVVar5 = Json::Value::operator[]((Value *)packageName.Value,"packagingInstallPrefix");
      Json::Value::operator=(pVVar5,&local_2c8);
      Json::Value::~Value(&local_2c8);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::allocator<char>::~allocator(&local_2f1);
    }
    else {
      Json::Value::Value(&local_320,false);
      pVVar5 = Json::Value::operator[]((Value *)packageName.Value,"setDestdir");
      Json::Value::operator=(pVVar5,&local_320);
      Json::Value::~Value(&local_320);
    }
    pcVar1 = this->Parent;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,"CPACK_STRIP_FILES",&local_371);
    local_350 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,&local_370);
    bVar2 = cmValue::IsOff(&local_350);
    Json::Value::Value(&local_348,!bVar2);
    pVVar5 = Json::Value::operator[]((Value *)packageName.Value,"stripFiles");
    Json::Value::operator=(pVVar5,&local_348);
    Json::Value::~Value(&local_348);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator(&local_371);
    pcVar1 = this->Parent;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"CPACK_WARN_ON_ABSOLUTE_INSTALL_DESTINATION",&local_3c1);
    bVar2 = cmCPackGenerator::IsOn(&pcVar1->super_cmCPackGenerator,&local_3c0);
    Json::Value::Value(&local_3a0,bVar2);
    pVVar5 = Json::Value::operator[]((Value *)packageName.Value,"warnOnAbsoluteInstallDestination");
    Json::Value::operator=(pVVar5,&local_3a0);
    Json::Value::~Value(&local_3a0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::~allocator(&local_3c1);
    pcVar1 = this->Parent;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,"CPACK_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION",
               (allocator<char> *)((long)&projects + 7));
    bVar2 = cmCPackGenerator::IsOn(&pcVar1->super_cmCPackGenerator,&local_410);
    Json::Value::Value(&local_3f0,bVar2);
    pVVar5 = Json::Value::operator[]((Value *)packageName.Value,"errorOnAbsoluteInstallDestination")
    ;
    Json::Value::operator=(pVVar5,&local_3f0);
    Json::Value::~Value(&local_3f0);
    std::__cxx11::string::~string((string *)&local_410);
    std::allocator<char>::~allocator((allocator<char> *)((long)&projects + 7));
    Json::Value::Value((Value *)&__range1,arrayValue);
    pVVar5 = Json::Value::operator[]((Value *)packageName.Value,"projects");
    pVVar5 = Json::Value::operator=(pVVar5,(Value *)&__range1);
    Json::Value::~Value((Value *)&__range1);
    this_00 = &(this->Parent->super_cmCPackGenerator).CMakeProjects;
    local_420 = pVVar5;
    __end1 = std::vector<cmCPackInstallCMakeProject,_std::allocator<cmCPackInstallCMakeProject>_>::
             begin(this_00);
    project = (cmCPackInstallCMakeProject *)
              std::vector<cmCPackInstallCMakeProject,_std::allocator<cmCPackInstallCMakeProject>_>::
              end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<cmCPackInstallCMakeProject_*,_std::vector<cmCPackInstallCMakeProject,_std::allocator<cmCPackInstallCMakeProject>_>_>
                                       *)&project), bVar2) {
      jsonProject.limit_ =
           (ptrdiff_t)
           __gnu_cxx::
           __normal_iterator<cmCPackInstallCMakeProject_*,_std::vector<cmCPackInstallCMakeProject,_std::allocator<cmCPackInstallCMakeProject>_>_>
           ::operator*(&__end1);
      Json::Value::Value((Value *)local_490,objectValue);
      Json::Value::Value(&local_4b8,(String *)(jsonProject.limit_ + 0x20));
      pVVar5 = Json::Value::operator[]((Value *)local_490,"projectName");
      Json::Value::operator=(pVVar5,&local_4b8);
      Json::Value::~Value(&local_4b8);
      Json::Value::Value(&local_4e0,(String *)(jsonProject.limit_ + 0x40));
      pVVar5 = Json::Value::operator[]((Value *)local_490,"component");
      Json::Value::operator=(pVVar5,&local_4e0);
      Json::Value::~Value(&local_4e0);
      Json::Value::Value(&local_508,(String *)jsonProject.limit_);
      pVVar5 = Json::Value::operator[]((Value *)local_490,"directory");
      Json::Value::operator=(pVVar5,&local_508);
      Json::Value::~Value(&local_508);
      Json::Value::Value((Value *)&installationTypes_1,(String *)(jsonProject.limit_ + 0x60));
      pVVar5 = Json::Value::operator[]((Value *)local_490,"subDirectory");
      Json::Value::operator=(pVVar5,(Value *)&installationTypes_1);
      Json::Value::~Value((Value *)&installationTypes_1);
      Json::Value::Value((Value *)&__range2,arrayValue);
      pVVar5 = Json::Value::operator[]((Value *)local_490,"installationTypes");
      pVVar5 = Json::Value::operator=(pVVar5,(Value *)&__range2);
      Json::Value::~Value((Value *)&__range2);
      this_01 = (vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> *)
                (jsonProject.limit_ + 0x80);
      local_538 = pVVar5;
      __end2 = std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::
               begin(this_01);
      installationType =
           (cmCPackInstallationType **)
           std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::end
                     (this_01);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<cmCPackInstallationType_**,_std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>_>
                                         *)&installationType), bVar2) {
        local_580 = __gnu_cxx::
                    __normal_iterator<cmCPackInstallationType_**,_std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>_>
                    ::operator*(&__end2);
        pVVar5 = local_538;
        Json::Value::Value((Value *)&components_1,&(*local_580)->Name);
        Json::Value::append(pVVar5,(Value *)&components_1);
        Json::Value::~Value((Value *)&components_1);
        __gnu_cxx::
        __normal_iterator<cmCPackInstallationType_**,_std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>_>
        ::operator++(&__end2);
      }
      Json::Value::Value((Value *)&__range2_1,arrayValue);
      pVVar5 = Json::Value::operator[]((Value *)local_490,"components");
      pVVar5 = Json::Value::operator=(pVVar5,(Value *)&__range2_1);
      Json::Value::~Value((Value *)&__range2_1);
      this_02 = (vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                (jsonProject.limit_ + 0x98);
      local_5b0 = pVVar5;
      __end2_1 = std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::begin
                           (this_02);
      component = (cmCPackComponent **)
                  std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::end(this_02)
      ;
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
                                 *)&component), bVar2) {
        local_5f8 = __gnu_cxx::
                    __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
                    ::operator*(&__end2_1);
        pVVar5 = local_5b0;
        Json::Value::Value((Value *)&installationTypes,&(*local_5f8)->Name);
        Json::Value::append(pVVar5,(Value *)&installationTypes);
        Json::Value::~Value((Value *)&installationTypes);
        __gnu_cxx::
        __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
        ::operator++(&__end2_1);
      }
      Json::Value::append(local_420,(Value *)local_490);
      Json::Value::~Value((Value *)local_490);
      __gnu_cxx::
      __normal_iterator<cmCPackInstallCMakeProject_*,_std::vector<cmCPackInstallCMakeProject,_std::allocator<cmCPackInstallCMakeProject>_>_>
      ::operator++(&__end1);
    }
    Json::Value::Value((Value *)&__range1_1,objectValue);
    pVVar5 = Json::Value::operator[]((Value *)packageName.Value,"installationTypes");
    pVVar5 = Json::Value::operator=(pVVar5,(Value *)&__range1_1);
    Json::Value::~Value((Value *)&__range1_1);
    this_03 = &(this->Parent->super_cmCPackGenerator).InstallationTypes;
    local_628 = pVVar5;
    __end1_1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
               ::begin(this_03);
    installationType_1 =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
            ::end(this_03);
    while (bVar2 = std::operator!=(&__end1_1,(_Self *)&installationType_1), bVar2) {
      jsonInstallationType =
           (Value *)std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>
                    ::operator*(&__end1_1);
      Json::Value::Value(&local_6a0,objectValue);
      pVVar5 = Json::Value::operator[](local_628,(String *)jsonInstallationType);
      pVVar5 = Json::Value::operator=(pVVar5,&local_6a0);
      Json::Value::~Value(&local_6a0);
      local_678 = pVVar5;
      Json::Value::Value(&local_6c8,(String *)&jsonInstallationType->limit_);
      pVVar5 = Json::Value::operator[](local_678,"name");
      Json::Value::operator=(pVVar5,&local_6c8);
      Json::Value::~Value(&local_6c8);
      Json::Value::Value(&local_6f0,(String *)&jsonInstallationType[1].start_);
      pVVar5 = Json::Value::operator[](local_678,"displayName");
      Json::Value::operator=(pVVar5,&local_6f0);
      Json::Value::~Value(&local_6f0);
      Json::Value::Value((Value *)&components,
                         *(UInt *)&jsonInstallationType[2].comments_.ptr_._M_t.
                                   super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                   .
                                   super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                   ._M_head_impl);
      pVVar5 = Json::Value::operator[](local_678,"index");
      Json::Value::operator=(pVVar5,(Value *)&components);
      Json::Value::~Value((Value *)&components);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>
      ::operator++(&__end1_1);
    }
    Json::Value::Value((Value *)&__range1_2,objectValue);
    pVVar5 = Json::Value::operator[]((Value *)packageName.Value,"components");
    pVVar5 = Json::Value::operator=(pVVar5,(Value *)&__range1_2);
    Json::Value::~Value((Value *)&__range1_2);
    this_04 = &(this->Parent->super_cmCPackGenerator).Components;
    local_720 = pVVar5;
    __end1_2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
               ::begin(this_04);
    component_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
                   *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                     ::end(this_04);
    while (bVar2 = std::operator!=(&__end1_2,(_Self *)&component_1), bVar2) {
      jsonComponent =
           (Value *)std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                    ::operator*(&__end1_2);
      Json::Value::Value(&local_798,objectValue);
      pVVar5 = Json::Value::operator[](local_720,(String *)jsonComponent);
      pVVar5 = Json::Value::operator=(pVVar5,&local_798);
      Json::Value::~Value(&local_798);
      local_770 = pVVar5;
      Json::Value::Value(&local_7c0,(String *)&jsonComponent->limit_);
      pVVar5 = Json::Value::operator[](local_770,"name");
      Json::Value::operator=(pVVar5,&local_7c0);
      Json::Value::~Value(&local_7c0);
      Json::Value::Value(&local_7e8,(String *)&jsonComponent[1].start_);
      pVVar5 = Json::Value::operator[](local_770,"displayName");
      Json::Value::operator=(pVVar5,&local_7e8);
      Json::Value::~Value(&local_7e8);
      if (jsonComponent[2].comments_.ptr_._M_t.
          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          .
          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          ._M_head_impl !=
          (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
           *)0x0) {
        Json::Value::Value(&local_810,
                           (jsonComponent[2].comments_.ptr_._M_t.
                            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            .
                            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                           ._M_head_impl)->_M_elems);
        pVVar5 = Json::Value::operator[](local_770,"group");
        Json::Value::operator=(pVVar5,&local_810);
        Json::Value::~Value(&local_810);
      }
      Json::Value::Value(&local_838,(bool)((byte)jsonComponent[2].start_ & 1));
      pVVar5 = Json::Value::operator[](local_770,"isRequired");
      Json::Value::operator=(pVVar5,&local_838);
      Json::Value::~Value(&local_838);
      Json::Value::Value(&local_860,(bool)((byte)jsonComponent[2].start_ >> 1 & 1));
      pVVar5 = Json::Value::operator[](local_770,"isHidden");
      Json::Value::operator=(pVVar5,&local_860);
      Json::Value::~Value(&local_860);
      Json::Value::Value(&local_888,(bool)((byte)jsonComponent[2].start_ >> 2 & 1));
      pVVar5 = Json::Value::operator[](local_770,"isDisabledByDefault");
      Json::Value::operator=(pVVar5,&local_888);
      Json::Value::~Value(&local_888);
      Json::Value::Value(&local_8b0,(bool)((byte)jsonComponent[2].start_ >> 3 & 1));
      pVVar5 = Json::Value::operator[](local_770,"isDownloaded");
      Json::Value::operator=(pVVar5,&local_8b0);
      Json::Value::~Value(&local_8b0);
      Json::Value::Value(&local_8d8,(String *)&jsonComponent[2].limit_);
      pVVar5 = Json::Value::operator[](local_770,"description");
      Json::Value::operator=(pVVar5,&local_8d8);
      Json::Value::~Value(&local_8d8);
      Json::Value::Value((Value *)&cmpInstallationTypes,(String *)&jsonComponent[4].bits_);
      pVVar5 = Json::Value::operator[](local_770,"archiveFile");
      Json::Value::operator=(pVVar5,(Value *)&cmpInstallationTypes);
      Json::Value::~Value((Value *)&cmpInstallationTypes);
      Json::Value::Value((Value *)&__range2_2,arrayValue);
      pVVar5 = Json::Value::operator[](local_770,"installationTypes");
      pVVar6 = Json::Value::operator=(pVVar5,(Value *)&__range2_2);
      Json::Value::~Value((Value *)&__range2_2);
      pVVar5 = jsonComponent + 3;
      local_908 = pVVar6;
      __end2_2 = std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                 ::begin((vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                          *)&pVVar5->start_);
      installationType_2 =
           (cmCPackInstallationType **)
           std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::end
                     ((vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                       *)&pVVar5->start_);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_2,
                                (__normal_iterator<cmCPackInstallationType_**,_std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>_>
                                 *)&installationType_2), bVar2) {
        local_950 = __gnu_cxx::
                    __normal_iterator<cmCPackInstallationType_**,_std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>_>
                    ::operator*(&__end2_2);
        pVVar5 = local_908;
        Json::Value::Value((Value *)&dependencies,&(*local_950)->Name);
        Json::Value::append(pVVar5,(Value *)&dependencies);
        Json::Value::~Value((Value *)&dependencies);
        __gnu_cxx::
        __normal_iterator<cmCPackInstallationType_**,_std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>_>
        ::operator++(&__end2_2);
      }
      Json::Value::Value((Value *)&__range2_3,arrayValue);
      pVVar5 = Json::Value::operator[](local_770,"dependencies");
      pVVar6 = Json::Value::operator=(pVVar5,(Value *)&__range2_3);
      Json::Value::~Value((Value *)&__range2_3);
      pVVar5 = jsonComponent + 5;
      local_980 = pVVar6;
      __end2_3 = std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::begin
                           ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                            &pVVar5->limit_);
      dep = (cmCPackComponent **)
            std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::end
                      ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                       &pVVar5->limit_);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_3,
                                (__normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
                                 *)&dep), bVar2) {
        local_9c8 = __gnu_cxx::
                    __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
                    ::operator*(&__end2_3);
        pVVar5 = local_980;
        Json::Value::Value((Value *)&groups,&(*local_9c8)->Name);
        Json::Value::append(pVVar5,(Value *)&groups);
        Json::Value::~Value((Value *)&groups);
        __gnu_cxx::
        __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
        ::operator++(&__end2_3);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
      ::operator++(&__end1_2);
    }
    Json::Value::Value((Value *)&__range1_3,objectValue);
    pVVar5 = Json::Value::operator[]((Value *)packageName.Value,"componentGroups");
    pVVar5 = Json::Value::operator=(pVVar5,(Value *)&__range1_3);
    Json::Value::~Value((Value *)&__range1_3);
    this_05 = &(this->Parent->super_cmCPackGenerator).ComponentGroups;
    local_9f8 = pVVar5;
    __end1_3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
               ::begin(this_05);
    group = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
               ::end(this_05);
    while (bVar2 = std::operator!=(&__end1_3,(_Self *)&group), bVar2) {
      jsonGroup = (Value *)std::
                           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
                           ::operator*(&__end1_3);
      Json::Value::Value(&local_a70,objectValue);
      pVVar5 = Json::Value::operator[](local_9f8,(String *)jsonGroup);
      pVVar5 = Json::Value::operator=(pVVar5,&local_a70);
      Json::Value::~Value(&local_a70);
      local_a48 = pVVar5;
      Json::Value::Value(&local_a98,(String *)&jsonGroup->limit_);
      pVVar5 = Json::Value::operator[](local_a48,"name");
      Json::Value::operator=(pVVar5,&local_a98);
      Json::Value::~Value(&local_a98);
      Json::Value::Value(&local_ac0,(String *)&jsonGroup[1].start_);
      pVVar5 = Json::Value::operator[](local_a48,"displayName");
      Json::Value::operator=(pVVar5,&local_ac0);
      Json::Value::~Value(&local_ac0);
      Json::Value::Value(&local_ae8,(String *)&jsonGroup[2].comments_);
      pVVar5 = Json::Value::operator[](local_a48,"description");
      Json::Value::operator=(pVVar5,&local_ae8);
      Json::Value::~Value(&local_ae8);
      Json::Value::Value(&local_b10,(bool)(*(byte *)&jsonGroup[3].bits_ & 1));
      pVVar5 = Json::Value::operator[](local_a48,"isBold");
      Json::Value::operator=(pVVar5,&local_b10);
      Json::Value::~Value(&local_b10);
      Json::Value::Value(&local_b38,(bool)(*(byte *)&jsonGroup[3].bits_ >> 1 & 1));
      pVVar5 = Json::Value::operator[](local_a48,"isExpandedByDefault");
      Json::Value::operator=(pVVar5,&local_b38);
      Json::Value::~Value(&local_b38);
      if (jsonGroup[4].value_.int_ != 0) {
        Json::Value::Value((Value *)&subgroups,(String *)jsonGroup[4].value_.map_);
        pVVar5 = Json::Value::operator[](local_a48,"parentGroup");
        Json::Value::operator=(pVVar5,(Value *)&subgroups);
        Json::Value::~Value((Value *)&subgroups);
      }
      Json::Value::Value((Value *)&__range2_4,arrayValue);
      pVVar5 = Json::Value::operator[](local_a48,"subgroups");
      pVVar6 = Json::Value::operator=(pVVar5,(Value *)&__range2_4);
      Json::Value::~Value((Value *)&__range2_4);
      pVVar5 = jsonGroup + 4;
      local_b68 = pVVar6;
      __end2_4 = std::vector<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>::
                 begin((vector<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_> *)
                       &pVVar5->bits_);
      subgroup = (cmCPackComponentGroup **)
                 std::vector<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>::end
                           ((vector<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>
                             *)&pVVar5->bits_);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_4,
                                (__normal_iterator<cmCPackComponentGroup_**,_std::vector<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>_>
                                 *)&subgroup), bVar2) {
        local_bb0 = __gnu_cxx::
                    __normal_iterator<cmCPackComponentGroup_**,_std::vector<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>_>
                    ::operator*(&__end2_4);
        pVVar5 = local_b68;
        Json::Value::Value((Value *)&groupComponents,&(*local_bb0)->Name);
        Json::Value::append(pVVar5,(Value *)&groupComponents);
        Json::Value::~Value((Value *)&groupComponents);
        __gnu_cxx::
        __normal_iterator<cmCPackComponentGroup_**,_std::vector<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>_>
        ::operator++(&__end2_4);
      }
      Json::Value::Value((Value *)&__range2_5,arrayValue);
      pVVar5 = Json::Value::operator[](local_a48,"components");
      pVVar6 = Json::Value::operator=(pVVar5,(Value *)&__range2_5);
      Json::Value::~Value((Value *)&__range2_5);
      pVVar5 = jsonGroup + 3;
      local_be0 = pVVar6;
      __end2_5 = std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::begin
                           ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                            &pVVar5->comments_);
      component_2 = (cmCPackComponent **)
                    std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::end
                              ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                               &pVVar5->comments_);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_5,
                                (__normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
                                 *)&component_2), bVar2) {
        local_c28 = __gnu_cxx::
                    __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
                    ::operator*(&__end2_5);
        pVVar5 = local_be0;
        Json::Value::Value(&local_c50,&(*local_c28)->Name);
        Json::Value::append(pVVar5,&local_c50);
        Json::Value::~Value(&local_c50);
        __gnu_cxx::
        __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
        ::operator++(&__end2_5);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
      ::operator++(&__end1_3);
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int cmCPackExternalGenerator::cmCPackExternalVersionGenerator::WriteToJSON(
  Json::Value& root)
{
  if (!this->WriteVersion(root)) {
    return 0;
  }

  cmValue packageName = this->Parent->GetOption("CPACK_PACKAGE_NAME");
  if (packageName) {
    root["packageName"] = *packageName;
  }

  cmValue packageVersion = this->Parent->GetOption("CPACK_PACKAGE_VERSION");
  if (packageVersion) {
    root["packageVersion"] = *packageVersion;
  }

  cmValue packageDescriptionFile =
    this->Parent->GetOption("CPACK_PACKAGE_DESCRIPTION_FILE");
  if (packageDescriptionFile) {
    root["packageDescriptionFile"] = *packageDescriptionFile;
  }

  cmValue packageDescriptionSummary =
    this->Parent->GetOption("CPACK_PACKAGE_DESCRIPTION_SUMMARY");
  if (packageDescriptionSummary) {
    root["packageDescriptionSummary"] = *packageDescriptionSummary;
  }

  cmValue buildConfigCstr = this->Parent->GetOption("CPACK_BUILD_CONFIG");
  if (buildConfigCstr) {
    root["buildConfig"] = *buildConfigCstr;
  }

  cmValue defaultDirectoryPermissions =
    this->Parent->GetOption("CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS");
  if (cmNonempty(defaultDirectoryPermissions)) {
    root["defaultDirectoryPermissions"] = *defaultDirectoryPermissions;
  }
  if (cmIsInternallyOn(this->Parent->GetOption("CPACK_SET_DESTDIR"))) {
    root["setDestdir"] = true;
    root["packagingInstallPrefix"] =
      *this->Parent->GetOption("CPACK_PACKAGING_INSTALL_PREFIX");
  } else {
    root["setDestdir"] = false;
  }

  root["stripFiles"] = !this->Parent->GetOption("CPACK_STRIP_FILES").IsOff();
  root["warnOnAbsoluteInstallDestination"] =
    this->Parent->IsOn("CPACK_WARN_ON_ABSOLUTE_INSTALL_DESTINATION");
  root["errorOnAbsoluteInstallDestination"] =
    this->Parent->IsOn("CPACK_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION");

  Json::Value& projects = root["projects"] = Json::Value(Json::arrayValue);
  for (auto& project : this->Parent->CMakeProjects) {
    Json::Value jsonProject(Json::objectValue);

    jsonProject["projectName"] = project.ProjectName;
    jsonProject["component"] = project.Component;
    jsonProject["directory"] = project.Directory;
    jsonProject["subDirectory"] = project.SubDirectory;

    Json::Value& installationTypes = jsonProject["installationTypes"] =
      Json::Value(Json::arrayValue);
    for (auto& installationType : project.InstallationTypes) {
      installationTypes.append(installationType->Name);
    }

    Json::Value& components = jsonProject["components"] =
      Json::Value(Json::arrayValue);
    for (auto& component : project.Components) {
      components.append(component->Name);
    }

    projects.append(jsonProject);
  }

  Json::Value& installationTypes = root["installationTypes"] =
    Json::Value(Json::objectValue);
  for (auto& installationType : this->Parent->InstallationTypes) {
    Json::Value& jsonInstallationType =
      installationTypes[installationType.first] =
        Json::Value(Json::objectValue);

    jsonInstallationType["name"] = installationType.second.Name;
    jsonInstallationType["displayName"] = installationType.second.DisplayName;
    jsonInstallationType["index"] = installationType.second.Index;
  }

  Json::Value& components = root["components"] =
    Json::Value(Json::objectValue);
  for (auto& component : this->Parent->Components) {
    Json::Value& jsonComponent = components[component.first] =
      Json::Value(Json::objectValue);

    jsonComponent["name"] = component.second.Name;
    jsonComponent["displayName"] = component.second.DisplayName;
    if (component.second.Group) {
      jsonComponent["group"] = component.second.Group->Name;
    }
    jsonComponent["isRequired"] = component.second.IsRequired;
    jsonComponent["isHidden"] = component.second.IsHidden;
    jsonComponent["isDisabledByDefault"] =
      component.second.IsDisabledByDefault;
    jsonComponent["isDownloaded"] = component.second.IsDownloaded;
    jsonComponent["description"] = component.second.Description;
    jsonComponent["archiveFile"] = component.second.ArchiveFile;

    Json::Value& cmpInstallationTypes = jsonComponent["installationTypes"] =
      Json::Value(Json::arrayValue);
    for (auto& installationType : component.second.InstallationTypes) {
      cmpInstallationTypes.append(installationType->Name);
    }

    Json::Value& dependencies = jsonComponent["dependencies"] =
      Json::Value(Json::arrayValue);
    for (auto& dep : component.second.Dependencies) {
      dependencies.append(dep->Name);
    }
  }

  Json::Value& groups = root["componentGroups"] =
    Json::Value(Json::objectValue);
  for (auto& group : this->Parent->ComponentGroups) {
    Json::Value& jsonGroup = groups[group.first] =
      Json::Value(Json::objectValue);

    jsonGroup["name"] = group.second.Name;
    jsonGroup["displayName"] = group.second.DisplayName;
    jsonGroup["description"] = group.second.Description;
    jsonGroup["isBold"] = group.second.IsBold;
    jsonGroup["isExpandedByDefault"] = group.second.IsExpandedByDefault;
    if (group.second.ParentGroup) {
      jsonGroup["parentGroup"] = group.second.ParentGroup->Name;
    }

    Json::Value& subgroups = jsonGroup["subgroups"] =
      Json::Value(Json::arrayValue);
    for (auto& subgroup : group.second.Subgroups) {
      subgroups.append(subgroup->Name);
    }

    Json::Value& groupComponents = jsonGroup["components"] =
      Json::Value(Json::arrayValue);
    for (auto& component : group.second.Components) {
      groupComponents.append(component->Name);
    }
  }

  return 1;
}